

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

Database_Result * __thiscall
Database::RawQuery(Database_Result *__return_storage_ptr__,Database *this,char *query,
                  bool tx_control)

{
  size_t *psVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var2;
  int iVar3;
  undefined4 uVar4;
  _List_node_base *p_Var5;
  long lVar6;
  size_type __new_size;
  mapped_type *pmVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  undefined7 in_register_00000009;
  long *plVar10;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  char *pcVar11;
  Database *pDVar12;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var13;
  uint uVar14;
  ulong uVar15;
  string *psVar16;
  _List_node_base *p_Var17;
  variant rescell;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  resrow;
  allocator<char> local_109;
  ulong local_108;
  Database_Result *local_100;
  size_t local_f8;
  _List_node_base *local_f0;
  string *local_e8;
  char *local_e0;
  string *local_d8;
  undefined4 local_cc;
  string local_c8;
  undefined1 local_a8 [17];
  undefined7 uStack_97;
  _List_node_base *p_Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  bool local_78;
  bool bStack_77;
  bool bStack_76;
  bool bStack_75;
  bool bStack_74;
  undefined3 uStack_73;
  var_type local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (this->connected == false) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar9[1] = "Not connected to database.";
    *puVar9 = &PTR__exception_001d3510;
    __cxa_throw(puVar9,&Database_QueryFailed::typeinfo,std::exception::~exception);
  }
  local_f8 = strlen(query);
  (__return_storage_ptr__->
  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ).
  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ).
  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ).
           super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ).
           super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  local_100 = __return_storage_ptr__;
  if (this->engine == SQLite) {
    iVar3 = sqlite3_exec(((this->impl)._M_t.
                          super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                          .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,
                         query,sqlite_callback,this,0);
    if (iVar3 == 0) {
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::operator=(&local_100->
                   super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  ,&(this->callbackdata).
                    super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 );
      local_100->error = (this->callbackdata).error;
      local_100->affected_rows = (this->callbackdata).affected_rows;
      p_Var13 = &((this->callbackdata).
                  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  .
                  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_h;
      p_Var2 = &((this->callbackdata).
                 super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 .
                 super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
      this_00 = p_Var13;
      if (p_Var2 != p_Var13) {
        do {
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(this_00);
          this_00 = this_00 + 1;
        } while (this_00 != p_Var2);
        (this->callbackdata).
        super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
        .
        super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var13;
      }
      return local_100;
    }
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
    pcVar11 = (char *)sqlite3_errmsg(((this->impl)._M_t.
                                      super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                      .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)
                                     ->field_0);
  }
  else {
    local_cc = (undefined4)CONCAT71(in_register_00000009,tx_control);
    if (this->engine == MySQL) {
      local_e8 = &this->host;
      local_d8 = &this->db;
      local_f0 = (_List_node_base *)&this->transaction_log;
      local_108 = 0;
      psVar16 = local_e8;
      local_e0 = query;
LAB_00130076:
      iVar3 = mysql_real_query(((this->impl)._M_t.
                                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                               field_0,query,local_f8);
      if (iVar3 == 0) {
        if ((this->in_transaction == true && (char)local_cc == '\0') &&
           (iVar3 = strncmp(query,"SELECT",6), iVar3 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,query,(allocator<char> *)&local_68);
          p_Var5 = (_List_node_base *)operator_new(0x30);
          p_Var5[1]._M_next = p_Var5 + 2;
          p_Var17 = (_List_node_base *)(local_a8 + 0x10);
          if ((_List_node_base *)local_a8._0_8_ == p_Var17) {
            p_Var5[2]._M_next = (_List_node_base *)CONCAT71(uStack_97,local_a8[0x10]);
            p_Var5[2]._M_prev = p_Stack_90;
          }
          else {
            p_Var5[1]._M_next = (_List_node_base *)local_a8._0_8_;
            p_Var5[2]._M_next = (_List_node_base *)CONCAT71(uStack_97,local_a8[0x10]);
          }
          p_Var5[1]._M_prev = (_List_node_base *)local_a8._8_8_;
          local_a8._8_8_ = (_List_node_base *)0x0;
          local_a8[0x10] = 0;
          local_a8._0_8_ = p_Var17;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &(this->transaction_log).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if ((_List_node_base *)local_a8._0_8_ != p_Var17) {
            operator_delete((void *)local_a8._0_8_,CONCAT71(uStack_97,local_a8[0x10]) + 1);
          }
        }
        uVar4 = mysql_field_count(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
        local_f8 = CONCAT44(local_f8._4_4_,uVar4);
        lVar6 = mysql_store_result(((this->impl)._M_t.
                                    super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                    .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                   field_0);
        if (lVar6 != 0) {
          local_e8 = (string *)mysql_fetch_fields(lVar6);
          plVar10 = (long *)local_e8;
          iVar3 = (int)local_f8;
          if (0 < (int)local_f8) {
            do {
              if (*plVar10 == 0) {
                puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
                puVar9[1] = "libMySQL critical failure!";
                *puVar9 = &PTR__exception_001d3510;
                __cxa_throw(puVar9,&Database_QueryFailed::typeinfo,std::exception::~exception);
              }
              iVar3 = iVar3 + -1;
              plVar10 = plVar10 + 0x10;
            } while (iVar3 != 0);
          }
          __new_size = mysql_num_rows(lVar6);
          std::
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
          ::resize(&local_100->
                    super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                   ,__new_size);
          local_e0 = (char *)lVar6;
          local_d8 = (string *)mysql_fetch_row(lVar6);
          local_f0 = (_List_node_base *)(local_f8 & 0xffffffff);
          local_108 = 0;
          while (local_d8 != (string *)0x0) {
            local_68._M_buckets = &local_68._M_single_bucket;
            local_68._M_bucket_count = 1;
            local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_68._M_element_count = 0;
            local_68._M_rehash_policy._M_max_load_factor = 1.0;
            local_68._M_rehash_policy._M_next_resize = 0;
            local_68._M_single_bucket = (__node_base_ptr)0x0;
            if (0 < (int)local_f8) {
              uVar15 = 0;
              psVar16 = local_e8;
              do {
                util::variant::variant((variant *)local_a8);
                iVar3 = (int)*(long *)((long)psVar16 + 0x70);
                if (((iVar3 < 10 && iVar3 != 7) || (iVar3 == 0xf6)) || (iVar3 == 0xd)) {
                  if (*(long *)((long)local_d8 + uVar15 * 8) == 0) {
                    util::variant::operator=((variant *)local_a8,0);
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_c8,*(char **)((long)local_d8 + uVar15 * 8),
                               &local_109);
                    iVar3 = util::to_int(&local_c8);
                    util::variant::operator=((variant *)local_a8,iVar3);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      local_c8.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                else {
                  pcVar11 = *(char **)((long)local_d8 + uVar15 * 8);
                  if (pcVar11 == (char *)0x0) {
                    pcVar11 = "";
                  }
                  util::variant::operator=((variant *)local_a8,pcVar11);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_c8,*(char **)psVar16,&local_109);
                pmVar7 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_68,&local_c8);
                *(undefined8 *)pmVar7 = local_a8._0_8_;
                pmVar7->val_float = (double)local_a8._8_8_;
                std::__cxx11::string::_M_assign((string *)&pmVar7->val_string);
                pmVar7->type = local_70;
                pmVar7->val_bool = local_78;
                pmVar7->cache_val[0] = bStack_77;
                pmVar7->cache_val[1] = bStack_76;
                pmVar7->cache_val[2] = bStack_75;
                pmVar7->cache_val[3] = bStack_74;
                *(undefined3 *)&pmVar7->field_0x35 = uStack_73;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_97,local_a8[0x10]) != &local_88) {
                  operator_delete((undefined1 *)CONCAT71(uStack_97,local_a8[0x10]),
                                  local_88._M_allocated_capacity + 1);
                }
                uVar15 = uVar15 + 1;
                psVar16 = (string *)((long)psVar16 + 0x80);
              } while (local_f0 != (_List_node_base *)uVar15);
            }
            p_Var13 = &(local_100->
                       super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       ).
                       super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_108]._M_h;
            if (&local_68 != p_Var13) {
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)p_Var13,&local_68);
            }
            local_108 = (ulong)((int)local_108 + 1);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_68);
            local_d8 = (string *)mysql_fetch_row(local_e0);
          }
          mysql_free_result(local_e0);
          return local_100;
        }
        if ((int)local_f8 == 0) {
          iVar3 = mysql_affected_rows(((this->impl)._M_t.
                                       super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                       .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl
                                      )->field_0);
          local_100->affected_rows = iVar3;
          return local_100;
        }
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar8 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        puVar9[1] = uVar8;
        *puVar9 = &PTR__exception_001d3510;
        __cxa_throw(puVar9,&Database_QueryFailed::typeinfo,std::exception::~exception);
      }
      iVar3 = mysql_errno(((this->impl)._M_t.
                           super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                           .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
      if (((iVar3 != 0x4b5) && (iVar3 != 0x7dd)) && (iVar3 != 0x7d6)) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar8 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        puVar9[1] = uVar8;
        *puVar9 = &PTR__exception_001d3510;
        __cxa_throw(puVar9,&Database_QueryFailed::typeinfo,std::exception::~exception);
      }
      uVar15 = 0;
LAB_001300b8:
      uVar14 = (int)uVar15 + 1;
      if ((int)uVar14 < 0xb) {
        do {
          uVar15 = (ulong)uVar14;
          Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)",
                       uVar15);
          pDVar12 = this;
          Close(this);
          util::sleep((uint)pDVar12);
          Connect(this,this->engine,psVar16,(unsigned_short)this->port,&this->user,&this->pass,
                  local_d8);
          if (this->connected != false) {
            if (this->in_transaction != true) goto LAB_00130076;
            iVar3 = mysql_real_query(((this->impl)._M_t.
                                      super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                      .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)
                                     ->field_0,"START TRANSACTION",0x11);
            p_Var17 = local_f0;
            if (iVar3 == 0) goto LAB_001301ad;
            iVar3 = mysql_errno(((this->impl)._M_t.
                                 super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                 .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                field_0);
            if (((iVar3 != 0x4b5) && (iVar3 != 0x7dd)) && (iVar3 != 0x7d6)) {
              uVar8 = mysql_error(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
              Console::Err("Error during recovery: %s",uVar8);
              Console::Err("Halting server.");
              goto LAB_001306a1;
            }
          }
          uVar14 = uVar14 + 1;
          if (uVar14 == 0xb) break;
        } while( true );
      }
      Console::Err("Could not re-connect to database. Halting server.");
LAB_001306a1:
      std::terminate();
    }
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
    pcVar11 = "Unknown database engine";
  }
  puVar9[1] = pcVar11;
  *puVar9 = &PTR__exception_001d3510;
  __cxa_throw(puVar9,&Database_QueryFailed::typeinfo,std::exception::~exception);
LAB_001301ad:
  p_Var17 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  if (p_Var17 == local_f0) goto LAB_00130259;
  iVar3 = mysql_real_query(((this->impl)._M_t.
                            super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                            .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,
                           p_Var17[1]._M_next,p_Var17[1]._M_prev);
  if (iVar3 == 0) {
    local_108 = mysql_use_result(((this->impl)._M_t.
                                  super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                  .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                 field_0);
  }
  iVar3 = mysql_errno(((this->impl)._M_t.
                       super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                       .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
  if (iVar3 < 0x7d6) {
    if (iVar3 == 0) {
      if (local_108 != 0) {
        mysql_free_result();
      }
      local_108 = 0;
    }
    else if (iVar3 != 0x4b5) goto LAB_001306d2;
  }
  else if ((iVar3 != 0x7d6) && (iVar3 != 0x7dd)) {
LAB_001306d2:
    uVar8 = mysql_error(((this->impl)._M_t.
                         super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                         .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
    Console::Err("Error during recovery: %s",uVar8);
    Console::Err("Halting server.");
    goto LAB_001306a1;
  }
  if (((iVar3 == 0x4b5) || (iVar3 == 0x7dd)) || (iVar3 == 0x7d6)) goto LAB_00130259;
  goto LAB_001301ad;
LAB_00130259:
  psVar16 = local_e8;
  query = local_e0;
  if (p_Var17 == local_f0) goto LAB_00130076;
  goto LAB_001300b8;
}

Assistant:

Database_Result Database::RawQuery(const char* query, bool tx_control)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::size_t query_length = std::strlen(query);

	Database_Result result;

#ifdef DATABASE_DEBUG
	Console::Dbg("%s", query);
#endif // DATABASE_DEBUG

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
		{
			MYSQL_RES* mresult = nullptr;
			MYSQL_FIELD* fields = nullptr;
			int num_fields = 0;

			exec_query:
			if (mysql_real_query(this->impl->mysql_handle, query, query_length) != 0)
			{
				int myerr = mysql_errno(this->impl->mysql_handle);
				int recovery_attempt = 0;

				if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
				{
					server_gone:

					if (++recovery_attempt > 10)
					{
						Console::Err("Could not re-connect to database. Halting server.");
						std::terminate();
					}

					Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)", recovery_attempt);
					this->Close();
					util::sleep(2.0 * recovery_attempt);

					try
					{
						this->Connect(this->engine, this->host, this->port, this->user, this->pass, this->db);
					}
					catch (const Database_OpenFailed& e)
					{
						Console::Err("Connection failed: %s", e.error());
					}

					if (!this->connected)
					{
						goto server_gone;
					}

					if (this->in_transaction)
					{
#ifdef DEBUG
						Console::Dbg("Replaying %i queries.", this->transaction_log.size());
#endif // DEBUG

						if (mysql_real_query(this->impl->mysql_handle, "START TRANSACTION", std::strlen("START TRANSACTION")) != 0)
						{
							int myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
						}

						for (const std::string& q : this->transaction_log)
						{
#ifdef DATABASE_DEBUG
							Console::Dbg("%s", q.c_str());
#endif // DATABASE_DEBUG
							int myerr = 0;
							int query_result = mysql_real_query(this->impl->mysql_handle, q.c_str(), q.length());

							if (query_result == 0)
							{
								mresult = mysql_use_result(this->impl->mysql_handle);
							}

							myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else if (myerr)
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
							else
							{
								if (mresult)
								{
									mysql_free_result(mresult);
									mresult = nullptr;
								}
							}
						}
					}

					goto exec_query;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			if (this->in_transaction && !tx_control)
			{
				using namespace std;

				if (strncmp(query, "SELECT", 6) != 0)
					this->transaction_log.emplace_back(std::string(query));
			}

			num_fields = mysql_field_count(this->impl->mysql_handle);

			if ((mresult = mysql_store_result(this->impl->mysql_handle)) == 0)
			{
				if (num_fields == 0)
				{
					result.affected_rows = mysql_affected_rows(this->impl->mysql_handle);
					return result;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			fields = mysql_fetch_fields(mresult);

			for (int i = 0; i < num_fields; ++i)
			{
				if (!fields[i].name)
				{
					throw Database_QueryFailed("libMySQL critical failure!");
				}
			}

			result.resize(mysql_num_rows(mresult));
			int i = 0;
			for (MYSQL_ROW row = mysql_fetch_row(mresult); row != 0; row = mysql_fetch_row(mresult))
			{
				std::unordered_map<std::string, util::variant> resrow;
				for (int ii = 0; ii < num_fields; ++ii)
				{
					util::variant rescell;
					if (IS_NUM(fields[ii].type))
					{
						if (row[ii])
						{
							rescell = util::to_int(row[ii]);
						}
						else
						{
							rescell = 0;
						}
					}
					else
					{
						if (row[ii])
						{
							rescell = row[ii];
						}
						else
						{
							rescell = "";
						}
					}
					resrow[fields[ii].name] = rescell;
				}
				result[i++] = resrow;
			}

			mysql_free_result(mresult);
		}
		break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			if (sqlite3_exec(this->impl->sqlite_handle, query, sqlite_callback, (void *)this, 0) != SQLITE_OK)
			{
				throw Database_QueryFailed(sqlite3_errmsg(this->impl->sqlite_handle));
			}
			result = this->callbackdata;
			this->callbackdata.clear();
			break;
#endif // DATABASE_SQLITE

		default:
			throw Database_QueryFailed("Unknown database engine");
	}

	return result;
}